

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O2

void __thiscall sc_core::sc_plist_base::erase_all(sc_plist_base *this)

{
  sc_plist_elem *psVar1;
  handle_t p;
  
  p = this->head;
  while (p != (handle_t)0x0) {
    psVar1 = p->next;
    sc_mempool::release(p,0x18);
    p = psVar1;
  }
  this->head = (handle_t)0x0;
  this->tail = (handle_t)0x0;
  return;
}

Assistant:

void
sc_plist_base::erase_all()
{
    handle_t p;
    for( handle_t h = head; h != 0; h = p ) {
        p = h->next;
        delete h;
    }
    head = 0;
    tail = 0;
}